

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyCloneNode(TidyDocImpl *doc,Node *element)

{
  uint uVar1;
  Lexer *pLVar2;
  Node *pNVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  
  pLVar2 = doc->lexer;
  pNVar3 = (Node *)(*pLVar2->allocator->vtbl->alloc)(pLVar2->allocator,0x68);
  pNVar3->parent = (Node *)0x0;
  pNVar3->prev = (Node *)0x0;
  pNVar3->next = (Node *)0x0;
  pNVar3->content = (Node *)0x0;
  pNVar3->last = (Node *)0x0;
  pNVar3->attributes = (AttVal *)0x0;
  pNVar3->was = (Dict *)0x0;
  pNVar3->tag = (Dict *)0x0;
  pNVar3->element = (tmbstr)0x0;
  pNVar3->start = 0;
  pNVar3->end = 0;
  pNVar3->type = RootNode;
  pNVar3->line = 0;
  pNVar3->column = 0;
  pNVar3->closed = no;
  pNVar3->implicit = no;
  pNVar3->linebreak = no;
  if (pLVar2 != (Lexer *)0x0) {
    pNVar3->line = pLVar2->lines;
    pNVar3->column = pLVar2->columns;
  }
  pNVar3->type = TextNode;
  uVar1 = pLVar2->lexsize;
  pNVar3->start = uVar1;
  pNVar3->end = uVar1;
  if (element != (Node *)0x0) {
    pNVar3->parent = element->parent;
    pNVar3->type = element->type;
    pNVar3->closed = element->closed;
    pNVar3->implicit = element->implicit;
    pNVar3->tag = element->tag;
    ptVar4 = prvTidytmbstrdup(doc->allocator,element->element);
    pNVar3->element = ptVar4;
    pAVar5 = prvTidyDupAttrs(doc,element->attributes);
    pNVar3->attributes = pAVar5;
  }
  return pNVar3;
}

Assistant:

Node *TY_(CloneNode)( TidyDocImpl* doc, Node *element )
{
    Lexer* lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );

    node->start = lexer->lexsize;
    node->end   = lexer->lexsize;

    if ( element )
    {
        node->parent     = element->parent;
        node->type       = element->type;
        node->closed     = element->closed;
        node->implicit   = element->implicit;
        node->tag        = element->tag;
        node->element    = TY_(tmbstrdup)( doc->allocator, element->element );
        node->attributes = TY_(DupAttrs)( doc, element->attributes );
    }
    return node;
}